

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O0

void boost::python::detail::
     def_init_aux<boost::python::class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector0<mpl_::na>,boost::mpl::size<boost::mpl::vector0<mpl_::na>>>
               (size<boost::mpl::vector0<mpl_::na>_> *param_1,char *param_2,object *param_3,
               char **param_4)

{
  value_holder<StimulationCommand> *in_stack_ffffffffffffffb8;
  keyword_range *in_stack_ffffffffffffffc0;
  default_call_policies *in_stack_ffffffffffffffc8;
  
  make_keyword_range_constructor<boost::mpl::vector0<mpl_::na>,boost::mpl::size<boost::mpl::vector0<mpl_::na>>,boost::python::objects::value_holder<StimulationCommand>,boost::python::default_call_policies>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (vector0<mpl_::na> *)&stack0xffffffffffffffc8,param_1);
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<boost::python::api::object,char_const*>
            ((class_<StimulationCommand,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)param_1,param_2,param_3,param_4);
  api::object::~object((object *)0x3ad910);
  return;
}

Assistant:

inline void def_init_aux(
      ClassT& cl
      , Signature const&
      , NArgs
      , CallPoliciesT const& policies
      , char const* doc
      , detail::keyword_range const& keywords_
      )
  {
      cl.def(
          "__init__"
        , detail::make_keyword_range_constructor<Signature,NArgs>(
              policies
            , keywords_
            , (typename ClassT::metadata::holder*)0
          )
        , doc
      );
  }